

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O2

bool __thiscall ON_BinaryArchive::EndRead3dmTable(ON_BinaryArchive *this,uint typecode)

{
  ON_3DM_BIG_CHUNK *pOVar1;
  bool bVar2;
  ON_3dmArchiveTableType table;
  char *sFormat;
  int iVar3;
  
  if (typecode == 0) {
    sFormat = "ON_BinaryArchive::EndRead3dmTable() bad typecode";
    iVar3 = 0x263a;
  }
  else {
    table = TableTypeFromTypecode(this,typecode);
    if (table == Unset) {
      sFormat = "ON_BinaryArchive::EndRead3dmTable() bad typecode";
      iVar3 = 0x2641;
    }
    else {
      if (this->m_3dm_active_table == table) {
        bVar2 = ArchiveContains3dmTable(this,table);
        if (bVar2) {
          iVar3 = (this->m_chunk).m_count;
          if (this->m_3dm_version == 1) {
            if (iVar3 != 0) {
              sFormat = "ON_BinaryArchive::EndRead3dmTable() v1 file m_chunk.Count() != 0";
              iVar3 = 0x2655;
              goto LAB_003cf93e;
            }
            bVar2 = SeekFromStart(this,0x20);
          }
          else {
            if (iVar3 != 1) {
              sFormat = "ON_BinaryArchive::EndRead3dmTable() v2 file m_chunk.Count() != 1";
              iVar3 = 0x265f;
              goto LAB_003cf93e;
            }
            pOVar1 = (this->m_chunk).m_a;
            if ((pOVar1 == (ON_3DM_BIG_CHUNK *)0x0) || (pOVar1->m_typecode != typecode)) {
              sFormat = "ON_BinaryArchive::EndRead3dmTable() m_chunk.Last()->typecode != typecode";
              iVar3 = 0x2665;
              goto LAB_003cf93e;
            }
            bVar2 = EndRead3dmChunk(this);
          }
          table = this->m_3dm_active_table;
        }
        else {
          bVar2 = true;
        }
        bVar2 = End3dmTable(this,table,bVar2);
        return bVar2;
      }
      sFormat = "ON_BinaryArchive::EndRead3dmTable() m_active_table != t";
      iVar3 = 0x2647;
    }
  }
LAB_003cf93e:
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_archive.cpp"
             ,iVar3,"",sFormat);
  return false;
}

Assistant:

bool ON_BinaryArchive::EndRead3dmTable( unsigned int typecode )
{
  bool rc = false;
  if (0 == typecode)
  {
    ON_ERROR("ON_BinaryArchive::EndRead3dmTable() bad typecode");
    return false;
  }

  const ON_3dmArchiveTableType tt = TableTypeFromTypecode(typecode);
  if (tt == ON_3dmArchiveTableType::Unset)
  {
    ON_ERROR("ON_BinaryArchive::EndRead3dmTable() bad typecode");
    return false;
  }

  if ( Active3dmTable() != tt ) 
  {
    ON_ERROR("ON_BinaryArchive::EndRead3dmTable() m_active_table != t");
    return false;
  }

  if (false == ArchiveContains3dmTable(tt))
  {
    // This archive was written by code that was compiled before the table was added.
    return End3dmTable(tt,true);
  }

  if ( m_3dm_version == 1 ) 
  {
    if ( m_chunk.Count() != 0 )
    {
      ON_ERROR("ON_BinaryArchive::EndRead3dmTable() v1 file m_chunk.Count() != 0");
      return false;
    }
    // rewind for next table
    rc = SeekFromStart(32)?true:false;
  }
  else {
    {
      if ( m_chunk.Count() != 1 ) 
      {
        ON_ERROR("ON_BinaryArchive::EndRead3dmTable() v2 file m_chunk.Count() != 1");
        return false;
      }
      const ON_3DM_BIG_CHUNK* c = m_chunk.Last();
      if ( 0 == c || c->m_typecode != typecode ) 
      {
        ON_ERROR("ON_BinaryArchive::EndRead3dmTable() m_chunk.Last()->typecode != typecode");
        return false;
      }
      rc = EndRead3dmChunk();
    }
  }
  return End3dmTable(m_3dm_active_table,rc);
}